

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.hpp
# Opt level: O2

void __thiscall diy::Master::Proxy::~Proxy(Proxy *this)

{
  IExchangeInfo *pIVar1;
  OutgoingQueues *this_00;
  IncomingQueues *this_01;
  critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
  *pcVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  int __type;
  int __type_00;
  undefined1 local_48 [24];
  
  this_00 = outgoing(this->master_,this->gid_);
  this_01 = incoming(this->master_,this->gid_);
  for (p_Var3 = (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->outgoing_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pcVar2 = concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
             ::operator[](this_00,(BlockID *)(p_Var3 + 1));
    critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
    ::access((critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
              *)local_48,(char *)pcVar2,__type);
    std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::
    emplace_back<diy::MemoryBuffer>
              ((deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *)
               local_48._0_8_,(MemoryBuffer *)&p_Var3[1]._M_parent);
    std::unique_lock<tthread::fast_mutex>::~unique_lock
              ((unique_lock<tthread::fast_mutex> *)(local_48 + 8));
    pIVar1 = this->iexchange_;
    if (pIVar1 != (IExchangeInfo *)0x0) {
      (*pIVar1->_vptr_IExchangeInfo[3])(pIVar1,1);
    }
  }
  if (this->iexchange_ == (IExchangeInfo *)0x0) {
    for (p_Var4 = (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->incoming_)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      pcVar2 = concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
               ::operator[](this_01,(int *)(p_Var4 + 1));
      critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
      ::access((critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                *)local_48,(char *)pcVar2,__type_00);
      std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::
      emplace_front<diy::MemoryBuffer>
                ((deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *)
                 local_48._0_8_,(MemoryBuffer *)&p_Var4[1]._M_parent);
      std::unique_lock<tthread::fast_mutex>::~unique_lock
                ((unique_lock<tthread::fast_mutex> *)(local_48 + 8));
    }
  }
  std::
  _Rb_tree<diy::BlockID,_std::pair<const_diy::BlockID,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
  ::~_Rb_tree(&(this->outgoing_)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_int,_diy::MemoryBuffer>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
  ::~_Rb_tree(&(this->incoming_)._M_t);
  return;
}

Assistant:

~Proxy()
    {
        auto& outgoing = master_->outgoing(gid_);
        auto& incoming = master_->incoming(gid_);

        // copy out outgoing_
        for (auto& x : outgoing_)
        {
            outgoing[x.first].access()->emplace_back(std::move(x.second));
            if (iexchange_)
                iexchange_->inc_work();
        }

        // move incoming_ back into master, in case it's a multi-foreach round
        if (!iexchange_)
            for (auto& x : incoming_)
                incoming[x.first].access()->emplace_front(std::move(x.second));
    }